

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzset_unlocked.c
# Opt level: O0

int zoneinit(state *sp,char *name)

{
  _Bool _Var1;
  int local_24;
  int err;
  char *name_local;
  state *sp_local;
  
  if ((name == (char *)0x0) || (*name != '\0')) {
    local_24 = _PDCLIB_tzload(name,sp,true);
    if ((local_24 != 0) &&
       (((name != (char *)0x0 && (*name != ':')) && (_Var1 = _PDCLIB_tzparse(name,sp,false), _Var1))
       )) {
      local_24 = 0;
    }
    if (local_24 == 0) {
      scrub_abbrs(sp);
    }
    sp_local._4_4_ = local_24;
  }
  else {
    sp->leapcnt = 0;
    sp->timecnt = 0;
    sp->typecnt = 0;
    sp->charcnt = 0;
    sp->goahead = false;
    sp->goback = false;
    _PDCLIB_init_ttinfo(sp->ttis,0,false,0);
    strcpy(sp->chars,"GMT");
    sp->defaulttype = 0;
    sp_local._4_4_ = 0;
  }
  return sp_local._4_4_;
}

Assistant:

static int zoneinit( struct state * sp, char const * name )
{
    if (name && ! name[0])
    {
        /* User wants it fast rather than right. */
        sp->leapcnt = 0;        /* so, we're off a little */
        sp->timecnt = 0;
        sp->typecnt = 0;
        sp->charcnt = 0;
        sp->goback = sp->goahead = false;
        _PDCLIB_init_ttinfo( &sp->ttis[ 0 ], 0, false, 0 );
        strcpy( sp->chars, gmt );
        sp->defaulttype = 0;
        return 0;
    }
    else
    {
        int err = _PDCLIB_tzload( name, sp, true );

        if ( err != 0 && name && name[ 0 ] != ':' && _PDCLIB_tzparse( name, sp, false ) )
        {
            err = 0;
        }

        if ( err == 0 )
        {
            scrub_abbrs( sp );
        }

        return err;
    }
}